

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.cpp
# Opt level: O0

int __thiscall pstore::file::in_memory::truncate(in_memory *this,char *__file,__off_t __length)

{
  element_type *peVar1;
  unsigned_long *puVar2;
  uint64_t size_local;
  in_memory *this_local;
  
  if (this->length_ < this->eof_) {
    assert_failed("eof_ <= length_",
                  "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/lib/os/file.cpp"
                  ,0x101);
  }
  if (this->pos_ <= this->eof_) {
    check_writable(this);
    if ((char *)this->length_ < __file) {
      raise<std::errc>(invalid_argument);
    }
    if ((char *)this->eof_ < __file) {
      peVar1 = std::__shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>::get
                         (&(this->buffer_).
                           super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>);
      memset(peVar1 + this->eof_,0,(long)__file - this->eof_);
    }
    this->eof_ = (uint64_t)__file;
    puVar2 = std::min<unsigned_long>(&this->pos_,&this->eof_);
    this->pos_ = *puVar2;
    return (int)this;
  }
  assert_failed("pos_ <= eof_",
                "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/lib/os/file.cpp"
                ,0x102);
}

Assistant:

void in_memory::truncate (std::uint64_t const size) {
            PSTORE_ASSERT (eof_ <= length_);
            PSTORE_ASSERT (pos_ <= eof_);
            this->check_writable ();

            if (size > length_) {
                raise (std::errc::invalid_argument);
            }
            if (size > eof_) {
                // Fill from the current end of file to the end of the newly available region.
                std::memset (buffer_.get () + eof_, 0, size - eof_);
            }
            eof_ = size;
            // Clamp pos inside the new file extent
            pos_ = std::min (pos_, eof_);
        }